

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::
ZLIBBufferCompressorTest_reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input_Test
::TestBody(ZLIBBufferCompressorTest_reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input_Test
           *this)

{
  string *lhs;
  __uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true> _Var1;
  long lVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  AssertionResult gtest_ar_2;
  AssertHelper local_210;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes2;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes1;
  ByteBuffer decompressed2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0 [5];
  ByteBuffer compressed2;
  char local_1b8 [32];
  size_t len1;
  ByteBuffer decompressed1;
  ByteBuffer compressed1;
  ZLIBBufferInflator decompressor1;
  ZLIBBufferCompressor compressor1;
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(&compressor1,5);
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress
            ((uchar *)&compressor1,
             (ulong)(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p,0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  len1 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(&decompressor1);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(&decompressed1);
  _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<const_char,_std::default_delete<const_char>_>)
       bidfx_public_api::tools::ByteBuffer::ToArray();
  decompressed_bytes1._M_t.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
       (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
       _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
       super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  _compressed2 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compressed2,
             _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
             super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
             super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
             (long)_Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
                   super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar2);
  lhs = &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&decompressed2,"BIGGER_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",lhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compressed2);
  std::__cxx11::string::~string((string *)&compressed2);
  if (decompressed2 == (ByteBuffer)0x0) {
    testing::Message::Message((Message *)&compressed2);
    if (local_1f0[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1f0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_240,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x133,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_240,(Message *)&compressed2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_240);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&compressed2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_1f0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_1f0);
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress
              ((uchar *)&compressor1,
               (ulong)(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_240._M_dataplus._M_p = (pointer)(lVar2 * 10);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&decompressed2,"len2 * 10","len1",(unsigned_long *)&local_240,&len1);
    if (decompressed2 == (ByteBuffer)0x0) {
      testing::Message::Message((Message *)&local_240);
      if (local_1f0[0].ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_1f0[0].ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x138,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_240);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_1f0);
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate(&decompressed2);
    _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
    super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<const_char,_std::default_delete<const_char>_>)
         bidfx_public_api::tools::ByteBuffer::ToArray();
    decompressed_bytes2._M_t.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>.
    _M_t.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
         (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
         _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
         super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
         super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
    lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
               super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
               super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
               (long)_Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
                     super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar2);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_2,"BIGGER_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",lhs,
               &local_240);
    std::__cxx11::string::~string((string *)&local_240);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_240);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_210,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x13c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_210);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_240);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr(&decompressed_bytes2)
    ;
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&decompressed2);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&compressed2);
  }
  std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr(&decompressed_bytes1);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&decompressed1);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(&decompressor1);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&compressed1);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(&compressor1);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();
    size_t len1 = compressed1.ReadableBytes();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(BIGGER_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed2 = compressor1.GetCompressed();
    size_t len2 = compressed2.ReadableBytes();
    EXPECT_LT(len2 * 10, len1);

    ByteBuffer decompressed2 = decompressor1.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(BIGGER_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}